

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3IndexAffinityStr(sqlite3 *db,Index *pIdx)

{
  short sVar1;
  Table *pTVar2;
  char *pcVar3;
  char local_33;
  char aff;
  i16 x;
  Table *pTab;
  int n;
  Index *pIdx_local;
  sqlite3 *db_local;
  
  if (pIdx->zColAff == (char *)0x0) {
    pTVar2 = pIdx->pTable;
    pcVar3 = (char *)sqlite3DbMallocRaw((sqlite3 *)0x0,(long)(int)(pIdx->nColumn + 1));
    pIdx->zColAff = pcVar3;
    if (pIdx->zColAff == (char *)0x0) {
      sqlite3OomFault(db);
      return (char *)0x0;
    }
    for (pTab._4_4_ = 0; pTab._4_4_ < (int)(uint)pIdx->nColumn; pTab._4_4_ = pTab._4_4_ + 1) {
      sVar1 = pIdx->aiColumn[pTab._4_4_];
      if (sVar1 < 0) {
        if (sVar1 == -1) {
          pIdx->zColAff[pTab._4_4_] = 'D';
        }
        else {
          local_33 = sqlite3ExprAffinity(pIdx->aColExpr->a[pTab._4_4_].pExpr);
          if (local_33 == '\0') {
            local_33 = 'A';
          }
          pIdx->zColAff[pTab._4_4_] = local_33;
        }
      }
      else {
        pIdx->zColAff[pTab._4_4_] = pTVar2->aCol[sVar1].affinity;
      }
    }
    pIdx->zColAff[pTab._4_4_] = '\0';
  }
  return pIdx->zColAff;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(sqlite3 *db, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+1);
    if( !pIdx->zColAff ){
      sqlite3OomFault(db);
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      i16 x = pIdx->aiColumn[n];
      if( x>=0 ){
        pIdx->zColAff[n] = pTab->aCol[x].affinity;
      }else if( x==XN_ROWID ){
        pIdx->zColAff[n] = SQLITE_AFF_INTEGER;
      }else{
        char aff;
        assert( x==XN_EXPR );
        assert( pIdx->aColExpr!=0 );
        aff = sqlite3ExprAffinity(pIdx->aColExpr->a[n].pExpr);
        if( aff==0 ) aff = SQLITE_AFF_BLOB;
        pIdx->zColAff[n] = aff;
      }
    }
    pIdx->zColAff[n] = 0;
  }
 
  return pIdx->zColAff;
}